

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O3

void zusolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  doublecomplex xj;
  doublecomplex local_48;
  
  if (0 < ncol) {
    pdVar11 = &M[((ulong)(uint)ncol - 1) * (long)ldm].i;
    iVar12 = 0;
    uVar10 = (ulong)(uint)ncol;
    uVar9 = ncol;
    do {
      uVar9 = uVar9 - 1;
      uVar7 = (ulong)uVar9;
      uVar3 = uVar10 - 1;
      z_div(&local_48,rhs + uVar3,M + uVar3 + (long)((int)uVar3 * ldm));
      rhs[uVar3].r = local_48.r;
      rhs[uVar3].i = local_48.i;
      if (1 < (long)uVar10) {
        lVar8 = 0;
        do {
          dVar4 = *(double *)((long)pdVar11 + lVar8 + -8);
          dVar5 = *(double *)((long)pdVar11 + lVar8);
          pdVar1 = (double *)((long)&rhs->r + lVar8);
          dVar6 = pdVar1[1];
          pdVar2 = (double *)((long)&rhs->r + lVar8);
          *pdVar2 = *pdVar1 - (dVar4 * local_48.r + dVar5 * -local_48.i);
          pdVar2[1] = dVar6 - (dVar4 * local_48.i + dVar5 * local_48.r);
          lVar8 = lVar8 + 0x10;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      iVar12 = iVar12 + 1;
      pdVar11 = pdVar11 + (long)ldm * -2;
      uVar10 = uVar3;
    } while (iVar12 != ncol);
  }
  return;
}

Assistant:

void zusolve (int ldm, int ncol, doublecomplex *M, doublecomplex *rhs)
{
    doublecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	z_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    zz_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    z_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}